

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::removeClause(SAT *this,Clause *c)

{
  uint uVar1;
  Lit p;
  uint uVar2;
  Lit *pLVar3;
  vec<WatchElem> *pvVar4;
  mapped_type *pmVar5;
  int *piVar6;
  Clause *in_RSI;
  long in_RDI;
  int id;
  uint i;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Lit in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  anon_union_8_2_743a5d44_for_WatchElem_0 in_stack_ffffffffffffffd0;
  WatchElem local_20;
  int local_18;
  int local_14;
  Clause *local_10;
  
  local_10 = in_RSI;
  pLVar3 = Clause::operator[]((Clause *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff8c);
  local_18 = pLVar3->x;
  local_14 = (int)operator~((Lit)0x291b1c);
  uVar1 = toInt((Lit)local_14);
  pvVar4 = vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar1);
  WatchElem::WatchElem(&local_20,local_10);
  vec<WatchElem>::remove(pvVar4,(char *)&local_20);
  Clause::operator[]((Clause *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
  p = operator~((Lit)0x291b84);
  uVar1 = toInt(p);
  pvVar4 = vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar1);
  WatchElem::WatchElem((WatchElem *)&stack0xffffffffffffffd0,local_10);
  vec<WatchElem>::remove(pvVar4,&stack0xffffffffffffffd0);
  if (((ulong)*local_10 & 1) == 0) {
    uVar1 = Clause::size(local_10);
    *(ulong *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - (ulong)uVar1;
  }
  else {
    uVar1 = Clause::size(local_10);
    *(ulong *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - (ulong)uVar1;
  }
  if (((ulong)*local_10 & 1) != 0) {
    uVar1 = 0;
    while (in_stack_ffffffffffffffcc = uVar1, uVar2 = Clause::size(local_10), uVar1 < uVar2) {
      pLVar3 = Clause::operator[]((Clause *)CONCAT44(uVar1,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff8c);
      in_stack_ffffffffffffffc8.x = pLVar3->x;
      ::var(in_stack_ffffffffffffffc8);
      decVarUse((SAT *)CONCAT44(uVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
      uVar1 = in_stack_ffffffffffffffcc + 1;
    }
  }
  if ((((ulong)*local_10 & 1) != 0) && ((so.learnt_stats & 1U) != 0)) {
    Clause::clauseID(local_10);
    pmVar5 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffffd0._pt,
                          (key_type *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8.x));
    std::operator<<((ostream *)learntStatsStream,(string *)pmVar5);
    std::operator<<((ostream *)learntStatsStream,",");
    piVar6 = Clause::rawActivity(local_10);
    std::ostream::operator<<(learntStatsStream,*piVar6);
    std::operator<<((ostream *)learntStatsStream,"\n");
  }
  free(local_10);
  return;
}

Assistant:

void SAT::removeClause(Clause& c) {
	assert(c.size() > 1);
	watches[toInt(~c[0])].remove(&c);
	watches[toInt(~c[1])].remove(&c);
	if (c.learnt) {
		learnts_literals -= c.size();
	} else {
		clauses_literals -= c.size();
	}

	if (c.learnt) {
		for (unsigned int i = 0; i < c.size(); i++) {
			decVarUse(var(c[i]));
		}
	}

	if (c.learnt) {
		//            learntClauseScore[c.clauseID()] = c.rawActivity();
		/* if (so.debug) { */
		if (so.learnt_stats) {
			const int id = c.clauseID();
			learntStatsStream << learntClauseString[id];
			learntStatsStream << ",";
			learntStatsStream << c.rawActivity();
			learntStatsStream << "\n";
			/* std::cerr << "clausescore," <<  << "," << c.rawActivity() << "\n"; */
		}
		/* } */
	}

	free(&c);
}